

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::Array2Struct::Array2Struct
          (Array2Struct *this,Expression *allocation,EscapeAnalyzer *analyzer,Function *func,
          Module *wasm)

{
  pointer left;
  bool bVar1;
  Index IVar2;
  Nullability nullable;
  StructNew *pSVar3;
  Block *pBVar4;
  mapped_type *pmVar5;
  reference __in;
  type *ppEVar6;
  optional<wasm::Type> type;
  ReFinalize local_308;
  HeapType local_1a0;
  Type local_198;
  uintptr_t local_190;
  PackedType local_188;
  Mutability MStack_184;
  HeapType local_180;
  HeapType reachedHeapType;
  type *_;
  type *reached;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_false>
  local_160;
  iterator __end2;
  iterator __begin2;
  unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
  *__range2;
  uintptr_t local_140;
  ArrayNewFixed *local_138;
  ArrayNewFixed *arrayNewFixed;
  undefined1 local_128 [12];
  uintptr_t local_118;
  uintptr_t local_110;
  LocalGet *local_108;
  uint local_fc;
  undefined1 local_f8 [4];
  Index i_1;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> gets;
  LocalSet *set;
  undefined1 auStack_c8 [4];
  Index local;
  HeapType local_b8;
  ArrayNew *local_b0;
  ArrayNew *arrayNew;
  HeapType local_90;
  uint local_84;
  undefined1 local_80 [4];
  Index i;
  FieldList fields;
  undefined1 local_58 [8];
  Field element;
  HeapType arrayType;
  Module *wasm_local;
  Function *func_local;
  EscapeAnalyzer *analyzer_local;
  Expression *allocation_local;
  Array2Struct *this_local;
  
  PostWalker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
  ::PostWalker(&this->
                super_PostWalker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
              );
  this->allocation = allocation;
  this->analyzer = analyzer;
  this->func = func;
  Builder::Builder(&this->builder,wasm);
  (this->originalType).id = (allocation->type).id;
  HeapType::HeapType(&this->structType);
  this->refinalize = false;
  IVar2 = getArrayNewSize(this,allocation);
  this->numFields = IVar2;
  element._8_8_ = wasm::Type::getHeapType(&allocation->type);
  HeapType::getArray((HeapType *)
                     &fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_58 = (undefined1  [8])
             fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_80);
  for (local_84 = 0; local_84 < this->numFields; local_84 = local_84 + 1) {
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::push_back
              ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_80,(value_type *)local_58)
    ;
  }
  Struct::Struct((Struct *)&arrayNew,(FieldList *)local_80);
  HeapType::HeapType(&local_90,(Struct *)&arrayNew);
  (this->structType).id = local_90.id;
  Struct::~Struct((Struct *)&arrayNew);
  local_b0 = Expression::dynCast<wasm::ArrayNew>(allocation);
  if (local_b0 == (ArrayNew *)0x0) {
    local_138 = Expression::dynCast<wasm::ArrayNewFixed>(allocation);
    if (local_138 == (ArrayNewFixed *)0x0) {
      handle_unreachable("bad allocation",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                         ,0x435);
    }
    local_140 = (this->structType).id;
    pSVar3 = Builder::makeStructNew<ArenaVector<wasm::Expression*>>
                       (&this->builder,(HeapType)local_140,&local_138->values);
    this->structNew = pSVar3;
    this->arrayNewReplacement = (Expression *)this->structNew;
  }
  else {
    bVar1 = ArrayNew::isWithDefault(local_b0);
    if (bVar1) {
      local_b8.id = (this->structType).id;
      std::initializer_list<wasm::Expression_*>::initializer_list
                ((initializer_list<wasm::Expression_*> *)auStack_c8);
      pSVar3 = Builder::makeStructNew(&this->builder,local_b8,_auStack_c8);
      this->structNew = pSVar3;
      this->arrayNewReplacement = (Expression *)this->structNew;
    }
    else {
      IVar2 = Builder::addVar(func,(Type)local_58);
      gets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)Builder::makeLocalSet(&this->builder,IVar2,local_b0->init);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_f8);
      for (local_fc = 0; local_fc < this->numFields; local_fc = local_fc + 1) {
        local_110 = (uintptr_t)local_58;
        local_108 = Builder::makeLocalGet(&this->builder,IVar2,(Type)local_58);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_f8,
                   (value_type *)&local_108);
      }
      local_118 = (this->structType).id;
      pSVar3 = Builder::
               makeStructNew<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                         (&this->builder,(HeapType)local_118,
                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          local_f8);
      left = gets.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
      this->structNew = pSVar3;
      pSVar3 = this->structNew;
      std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_128);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._12_4_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)local_128._0_8_;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_128[8];
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_3_ = local_128._9_3_;
      pBVar4 = Builder::makeSequence(&this->builder,(Expression *)left,(Expression *)pSVar3,type);
      this->arrayNewReplacement = (Expression *)pBVar4;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_f8);
    }
  }
  pmVar5 = std::
           unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
           ::operator[](&analyzer->reachedInteractions,&this->arrayNewReplacement);
  *pmVar5 = Flows;
  __range2 = (unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
              *)this->structNew;
  pmVar5 = std::
           unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
           ::operator[](&analyzer->reachedInteractions,(key_type *)&__range2);
  *pmVar5 = Flows;
  __end2 = std::
           unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
           ::begin(&analyzer->reachedInteractions);
  local_160._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
       ::end(&analyzer->reachedInteractions);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_false>
                            ,&local_160), bVar1) {
    __in = std::__detail::
           _Node_iterator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_false,_false>
           ::operator*(&__end2);
    ppEVar6 = std::
              get<0ul,wasm::Expression*const,wasm::(anonymous_namespace)::ParentChildInteraction>
                        (__in);
    reachedHeapType.id =
         (uintptr_t)
         std::get<1ul,wasm::Expression*const,wasm::(anonymous_namespace)::ParentChildInteraction>
                   (__in);
    bVar1 = Expression::is<wasm::RefCast>(*ppEVar6);
    if ((!bVar1) && (bVar1 = wasm::Type::isRef(&(*ppEVar6)->type), bVar1)) {
      local_190 = (uintptr_t)wasm::Type::getHeapType(&(*ppEVar6)->type);
      local_188 = element.packedType;
      MStack_184 = element.mutable_;
      local_180 = (HeapType)local_190;
      bVar1 = HeapType::isSubType((HeapType)element._8_8_,(HeapType)local_190);
      if (bVar1) {
        bVar1 = HeapType::operator!=((HeapType *)&element.packedType,&local_180);
        if (bVar1) {
          this->refinalize = true;
        }
        local_1a0.id = (this->structType).id;
        nullable = wasm::Type::getNullability(&(*ppEVar6)->type);
        wasm::Type::Type(&local_198,local_1a0,nullable,Inexact);
        ((*ppEVar6)->type).id = local_198.id;
      }
    }
    std::__detail::
    _Node_iterator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>,_false,_false>
    ::operator++(&__end2);
  }
  Walker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
  ::walk((Walker<wasm::(anonymous_namespace)::Array2Struct,_wasm::Visitor<wasm::(anonymous_namespace)::Array2Struct,_void>_>
          *)this,&func->body);
  if ((this->refinalize & 1U) != 0) {
    ReFinalize::ReFinalize(&local_308);
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
              (&local_308.
                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                .
                super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
               func,wasm);
    ReFinalize::~ReFinalize(&local_308);
  }
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_80);
  return;
}

Assistant:

Array2Struct(Expression* allocation,
               EscapeAnalyzer& analyzer,
               Function* func,
               Module& wasm)
    : allocation(allocation), analyzer(analyzer), func(func), builder(wasm),
      originalType(allocation->type) {

    // Build the struct type we need: as many fields as the size of the array,
    // all of the same type as the array's element.
    numFields = getArrayNewSize(allocation);
    auto arrayType = allocation->type.getHeapType();
    auto element = arrayType.getArray().element;
    FieldList fields;
    for (Index i = 0; i < numFields; i++) {
      fields.push_back(element);
    }
    structType = Struct(fields);

    // Generate a StructNew to replace the ArrayNew*.
    if (auto* arrayNew = allocation->dynCast<ArrayNew>()) {
      if (arrayNew->isWithDefault()) {
        structNew = builder.makeStructNew(structType, {});
        arrayNewReplacement = structNew;
      } else {
        // The ArrayNew is writing the same value to each slot of the array. To
        // do the same for the struct, we store that value in an local and
        // generate multiple local.gets of it.
        auto local = builder.addVar(func, element.type);
        auto* set = builder.makeLocalSet(local, arrayNew->init);
        std::vector<Expression*> gets;
        for (Index i = 0; i < numFields; i++) {
          gets.push_back(builder.makeLocalGet(local, element.type));
        }
        structNew = builder.makeStructNew(structType, gets);
        // The ArrayNew* will be replaced with a block containing the local.set
        // and the structNew.
        arrayNewReplacement = builder.makeSequence(set, structNew);
      }
    } else if (auto* arrayNewFixed = allocation->dynCast<ArrayNewFixed>()) {
      // Simply use the same values as the array.
      structNew = builder.makeStructNew(structType, arrayNewFixed->values);
      arrayNewReplacement = structNew;
    } else {
      WASM_UNREACHABLE("bad allocation");
    }

    // Mark new expressions we created as flowing out the allocation. We need to
    // inform the analysis of this because Struct2Local will only process such
    // code (it depends on the analysis to tell it what the allocation is and
    // where it flowed). Note that the two values here may be identical but
    // there is no harm to doing this twice in that case.
    analyzer.reachedInteractions[structNew] =
      analyzer.reachedInteractions[arrayNewReplacement] =
        ParentChildInteraction::Flows;

    // Update types along the path reached by the allocation: whenever we see
    // the array type, it should be the struct type. Note that we do this before
    // the walk that is after us, because the walk may read these types and
    // depend on them to be valid.
    //
    // Note that |reached| contains array.get operations, which are reached in
    // the analysis, and so we will update their types if they happen to have
    // the array type (which can be the case of an array of arrays). But that is
    // fine to do as the array.get is rewritten to a struct.get which is then
    // lowered away to locals anyhow.
    for (auto& [reached, _] : analyzer.reachedInteractions) {
      if (reached->is<RefCast>()) {
        // Casts must be handled later: We need to see the old type, and to
        // potentially replace the cast based on that, see below.
        continue;
      }

      if (!reached->type.isRef()) {
        continue;
      }

      // The allocation type may be generalized as it flows around. If we do see
      // such generalizing, then we are refining here and must refinalize.
      auto reachedHeapType = reached->type.getHeapType();
      if (HeapType::isSubType(arrayType, reachedHeapType)) {
        if (arrayType != reachedHeapType) {
          refinalize = true;
        }
        reached->type = Type(structType, reached->type.getNullability());
      }
    }

    // Technically we should also fix up the types of locals as well, but after
    // Struct2Local those locals will no longer be used anyhow (the locals hold
    // allocations that are removed), so avoid that work (though it makes the
    // IR temporarily invalid in between Array2Struct and Struct2Local).

    // Replace the things we need to using the visit* methods.
    walk(func->body);

    if (refinalize) {
      ReFinalize().walkFunctionInModule(func, &wasm);
    }
  }